

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coro_http_client.hpp
# Opt level: O0

Lazy<std::error_code> __thiscall
cinatra::coro_http_client::handle_multipart<std::__cxx11::string>
          (coro_http_client *this,resp_data *data,
          req_context<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *ctx)

{
  coro_http_client *conn;
  string_view buf;
  string_view boundary;
  error_code *peVar1;
  bool bVar2;
  undefined8 *puVar3;
  undefined8 *extraout_RAX;
  undefined8 *extraout_RAX_00;
  undefined8 *extraout_RAX_01;
  __enable_if_t<__assignable<std::error_code,_unsigned_long>(),_tuple<error_code_&,_unsigned_long_&>_&>
  ptVar4;
  undefined8 *extraout_RAX_02;
  undefined8 in_RDX;
  multipart_reader_t<cinatra::coro_http_client> *in_RSI;
  LazyBase<std::error_code,_false> in_RDI;
  req_context<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffffb78;
  undefined4 in_stack_fffffffffffffb80;
  undefined4 in_stack_fffffffffffffb84;
  undefined4 in_stack_fffffffffffffb88;
  undefined4 in_stack_fffffffffffffb8c;
  undefined4 in_stack_fffffffffffffb90;
  undefined4 in_stack_fffffffffffffb94;
  LazyPromise<std::error_code> *in_stack_fffffffffffffb98;
  undefined4 in_stack_fffffffffffffba0;
  undefined4 in_stack_fffffffffffffba4;
  int local_454;
  undefined4 in_stack_fffffffffffffbb0;
  undefined4 in_stack_fffffffffffffbb4;
  undefined4 in_stack_fffffffffffffbb8;
  undefined4 in_stack_fffffffffffffbbc;
  undefined4 in_stack_fffffffffffffbc0;
  undefined4 in_stack_fffffffffffffbc4;
  undefined4 in_stack_fffffffffffffbe8;
  undefined4 in_stack_fffffffffffffbec;
  undefined4 local_410;
  int local_3f0;
  int local_3d0;
  int local_37c;
  basic_seq_coro_file<(coro_io::execution_type)1> *this_00;
  undefined8 *puVar5;
  error_code *this_01;
  allocator<char> local_11d [13];
  string_view local_110;
  multipart_reader_t<cinatra::coro_http_client> *in_stack_ffffffffffffff38;
  string_view in_stack_ffffffffffffff40;
  multipart_reader_t<cinatra::coro_http_client> *this_02;
  Handle HVar6;
  char *in_stack_ffffffffffffffe0;
  
  this_02 = in_RSI;
  HVar6 = in_RDI._coro.__handle_;
  puVar3 = (undefined8 *)operator_new(0x1f8,(nothrow_t *)&std::nothrow);
  if (puVar3 == (undefined8 *)0x0) {
    async_simple::coro::detail::LazyPromise<std::error_code>::
    get_return_object_on_allocation_failure();
  }
  else {
    *puVar3 = handle_multipart<std::__cxx11::string>;
    puVar3[1] = handle_multipart<std::__cxx11::string>;
    this_00 = (basic_seq_coro_file<(coro_io::execution_type)1> *)(puVar3 + 0x35);
    puVar5 = puVar3 + 0x36;
    this_01 = (error_code *)(puVar3 + 0x1c);
    puVar3[0x3d] = in_RSI;
    puVar3[0x33] = in_RDX;
    req_context<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    req_context((req_context<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
                in_stack_fffffffffffffb78);
    async_simple::coro::detail::LazyPromise<std::error_code>::LazyPromise
              ((LazyPromise<std::error_code> *)
               CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80));
    async_simple::coro::detail::LazyPromise<std::error_code>::get_return_object
              (in_stack_fffffffffffffb98);
    async_simple::coro::detail::LazyPromiseBase::initial_suspend((LazyPromiseBase *)(puVar3 + 2));
    bVar2 = std::suspend_always::await_ready((suspend_always *)((long)puVar3 + 0x1f5));
    if (bVar2) {
      std::suspend_always::await_resume((suspend_always *)((long)puVar3 + 0x1f5));
      std::error_code::error_code
                ((error_code *)CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80));
      local_110 = http_parser::get_boundary
                            ((http_parser *)
                             CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0));
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffbc4,in_stack_fffffffffffffbc0),
                 (basic_string_view<char,_std::char_traits<char>_> *)
                 CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8),
                 (allocator<char> *)CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0));
      conn = (coro_http_client *)puVar3[0x3d];
      std::allocator<char>::~allocator(local_11d);
      multipart_reader_t<cinatra::coro_http_client>::multipart_reader_t
                ((multipart_reader_t<cinatra::coro_http_client> *)(puVar3 + 0x25),conn);
      local_410 = in_stack_fffffffffffffbe8;
      while( true ) {
        std::__cxx11::string::operator_cast_to_basic_string_view
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80));
        boundary._M_str = in_stack_ffffffffffffffe0;
        boundary._M_len = (size_t)HVar6.__handle_;
        multipart_reader_t<cinatra::coro_http_client>::read_part_head(this_02,boundary);
        async_simple::coro::detail::LazyPromiseBase::
        await_transform<async_simple::coro::Lazy<cinatra::part_head_t>>
                  ((LazyPromiseBase *)CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88),
                   (Lazy<cinatra::part_head_t> *)
                   CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80));
        bVar2 = async_simple::coro::detail::LazyAwaiterBase<cinatra::part_head_t>::await_ready
                          ((LazyAwaiterBase<cinatra::part_head_t> *)this_00);
        if (!bVar2) break;
        puVar3[0x30] = (error_code *)(puVar3 + 0x12);
        puVar3[0x31] = this_00;
        async_simple::coro::detail::LazyAwaiterBase<cinatra::part_head_t>::awaitResume
                  ((LazyAwaiterBase<cinatra::part_head_t> *)
                   CONCAT44(in_stack_fffffffffffffbec,local_410));
        async_simple::coro::detail::LazyBase<cinatra::part_head_t,_false>::ValueAwaiter::
        ~ValueAwaiter((ValueAwaiter *)0x2bcdfa);
        async_simple::coro::Lazy<cinatra::part_head_t>::~Lazy
                  ((Lazy<cinatra::part_head_t> *)0x2bce07);
        bVar2 = std::error_code::operator_cast_to_bool((error_code *)(puVar3 + 0x12));
        if (bVar2) {
          async_simple::coro::detail::LazyPromise<std::error_code>::return_value<std::error_code_&>
                    ((LazyPromise<std::error_code> *)
                     CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
                     (error_code *)in_stack_fffffffffffffb78);
          local_3d0 = 3;
        }
        else {
          std::__cxx11::string::operator_cast_to_basic_string_view
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80));
          multipart_reader_t<cinatra::coro_http_client>::read_part_body
                    (in_stack_ffffffffffffff38,in_stack_ffffffffffffff40);
          async_simple::coro::detail::LazyPromiseBase::
          await_transform<async_simple::coro::Lazy<cinatra::chunked_result>>
                    ((LazyPromiseBase *)
                     CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88),
                     (Lazy<cinatra::chunked_result> *)
                     CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80));
          bVar2 = async_simple::coro::detail::LazyAwaiterBase<cinatra::chunked_result>::await_ready
                            ((LazyAwaiterBase<cinatra::chunked_result> *)(puVar3 + 0x37));
          if (!bVar2) {
            *(undefined1 *)((long)puVar3 + 500) = 2;
            handle_multipart((void *)CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0),
                             in_stack_fffffffffffffb98);
            (*(code *)*extraout_RAX_00)(extraout_RAX_00);
            return (Lazy<std::error_code>)in_RDI._coro.__handle_.__handle_;
          }
          puVar3[0x2f] = (LazyAwaiterBase<cinatra::chunked_result> *)(puVar3 + 0x37);
          async_simple::coro::detail::LazyAwaiterBase<cinatra::chunked_result>::awaitResume
                    ((LazyAwaiterBase<cinatra::chunked_result> *)
                     CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0));
          async_simple::coro::detail::LazyBase<cinatra::chunked_result,_false>::ValueAwaiter::
          ~ValueAwaiter((ValueAwaiter *)0x2bd03e);
          async_simple::coro::Lazy<cinatra::chunked_result>::~Lazy
                    ((Lazy<cinatra::chunked_result> *)0x2bd04b);
          if (puVar3[0x11] == 0) {
            peVar1 = this_01 + 1;
            std::basic_string_view<char,_std::char_traits<char>_>::data
                      ((basic_string_view<char,_std::char_traits<char>_> *)&peVar1->_M_cat);
            std::basic_string_view<char,_std::char_traits<char>_>::size
                      ((basic_string_view<char,_std::char_traits<char>_> *)&peVar1->_M_cat);
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90),
                       (char *)CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88),
                       CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80));
          }
          else {
            buf._M_str = (char *)this_01;
            buf._M_len = (size_t)puVar5;
            coro_io::basic_seq_coro_file<(coro_io::execution_type)1>::async_write(this_00,buf);
            async_simple::coro::detail::LazyPromiseBase::
            await_transform<async_simple::coro::Lazy<std::pair<std::error_code,unsigned_long>>>
                      ((LazyPromiseBase *)
                       CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88),
                       (Lazy<std::pair<std::error_code,_unsigned_long>_> *)
                       CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80));
            bVar2 = async_simple::coro::detail::
                    LazyAwaiterBase<std::pair<std::error_code,_unsigned_long>_>::await_ready
                              ((LazyAwaiterBase<std::pair<std::error_code,_unsigned_long>_> *)
                               (puVar3 + 0x3a));
            if (!bVar2) {
              *(undefined1 *)((long)puVar3 + 500) = 3;
              handle_multipart((void *)CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0)
                               ,in_stack_fffffffffffffb98);
              (*(code *)*extraout_RAX_01)(extraout_RAX_01);
              return (Lazy<std::error_code>)in_RDI._coro.__handle_.__handle_;
            }
            puVar3[0x32] = (LazyAwaiterBase<std::pair<std::error_code,_unsigned_long>_> *)
                           (puVar3 + 0x3a);
            async_simple::coro::detail::LazyAwaiterBase<std::pair<std::error_code,_unsigned_long>_>
            ::awaitResume((LazyAwaiterBase<std::pair<std::error_code,_unsigned_long>_> *)
                          CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0));
            std::tie<std::error_code,unsigned_long>
                      ((error_code *)CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88),
                       (unsigned_long *)
                       CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80));
            ptVar4 = std::tuple<std::error_code&,unsigned_long&>::operator=
                               ((tuple<std::error_code_&,_unsigned_long_&> *)
                                CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90),
                                (pair<std::error_code,_unsigned_long> *)
                                CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88));
            puVar3[0x3c] = ptVar4;
            async_simple::coro::detail::LazyBase<std::pair<std::error_code,_unsigned_long>,_false>::
            ValueAwaiter::~ValueAwaiter((ValueAwaiter *)0x2bd284);
            async_simple::coro::Lazy<std::pair<std::error_code,_unsigned_long>_>::~Lazy
                      ((Lazy<std::pair<std::error_code,_unsigned_long>_> *)0x2bd291);
            in_stack_fffffffffffffbec = 0;
            local_410 = 0;
          }
          bVar2 = std::error_code::operator_cast_to_bool(this_01);
          if (bVar2) {
            async_simple::coro::detail::LazyPromise<std::error_code>::
            return_value<std::error_code_&>
                      ((LazyPromise<std::error_code> *)
                       CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
                       (error_code *)in_stack_fffffffffffffb78);
            local_3f0 = 3;
          }
          else if ((this_01[1]._M_value & 1) == 0) {
            local_3f0 = 0;
          }
          else {
            local_3f0 = 5;
          }
          local_3d0 = local_3f0;
        }
        local_454 = local_3d0;
        part_head_t::~part_head_t
                  ((part_head_t *)CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80));
        if (local_454 != 0) {
          if (local_454 == 5) {
            async_simple::coro::detail::LazyPromise<std::error_code>::return_value<std::error_code>
                      ((LazyPromise<std::error_code> *)
                       CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
                       (error_code *)in_stack_fffffffffffffb78);
            local_454 = 3;
          }
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80));
          local_37c = local_454;
          if (local_454 == 3) {
            async_simple::coro::detail::LazyPromiseBase::final_suspend
                      ((LazyPromiseBase *)(puVar3 + 2));
            bVar2 = async_simple::coro::detail::LazyPromiseBase::FinalAwaiter::await_ready
                              ((FinalAwaiter *)((long)puVar3 + 0x1f6));
            if (!bVar2) {
              *puVar3 = 0;
              *(undefined1 *)((long)puVar3 + 500) = 4;
              handle_multipart((void *)CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90)
                               ,(void *)CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88
                                                ));
              (*(code *)*extraout_RAX_02)(extraout_RAX_02);
              return (Lazy<std::error_code>)in_RDI._coro.__handle_.__handle_;
            }
            async_simple::coro::detail::LazyPromiseBase::FinalAwaiter::await_resume
                      ((FinalAwaiter *)((long)puVar3 + 0x1f6));
            in_stack_fffffffffffffb84 = 0;
            local_37c = 0;
          }
          async_simple::coro::detail::LazyPromise<std::error_code>::~LazyPromise
                    ((LazyPromise<std::error_code> *)0x2bd617);
          req_context<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~req_context((req_context<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)CONCAT44(in_stack_fffffffffffffb84,local_37c));
          if (puVar3 == (undefined8 *)0x0) {
            return (Lazy<std::error_code>)in_RDI._coro.__handle_.__handle_;
          }
          operator_delete(puVar3,0x1f8);
          return (Lazy<std::error_code>)in_RDI._coro.__handle_.__handle_;
        }
        in_stack_fffffffffffffbb4 = 0;
      }
      *(undefined1 *)((long)puVar3 + 500) = 1;
      handle_multipart((void *)CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0),
                       in_stack_fffffffffffffb98);
      (*(code *)*extraout_RAX)(extraout_RAX);
    }
    else {
      *(undefined1 *)((long)puVar3 + 500) = 0;
      handle_multipart((void *)CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90),
                       (void *)CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88));
    }
  }
  return (Lazy<std::error_code>)in_RDI._coro.__handle_;
}

Assistant:

async_simple::coro::Lazy<std::error_code> handle_multipart(
      resp_data &data, req_context<String> ctx) {
    std::error_code ec{};
    std::string boundary = std::string{parser_.get_boundary()};
    multipart_reader_t multipart(this);
    while (true) {
      auto part_head = co_await multipart.read_part_head(boundary);
      if (part_head.ec) {
        co_return part_head.ec;
      }

      auto part_body = co_await multipart.read_part_body(boundary);

      if (ctx.resp_body_stream) {
        size_t size;
        std::tie(ec, size) =
            co_await ctx.resp_body_stream->async_write(part_body.data);
      }
      else {
        resp_chunk_str_.append(part_body.data.data(), part_body.data.size());
      }

      if (part_body.ec) {
        co_return part_body.ec;
      }

      if (part_body.eof) {
        break;
      }
    }
    co_return ec;
  }